

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O3

void __thiscall pool_layer_t::activate(pool_layer_t *this)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  float *pfVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  undefined1 auVar10 [64];
  uint local_5c;
  uint local_58;
  
  iVar5 = (this->super_layer_t).out.size.x;
  if (0 < iVar5) {
    iVar8 = (this->super_layer_t).out.size.y;
    local_5c = 0;
    do {
      if (0 < iVar8) {
        iVar5 = (this->super_layer_t).out.size.z;
        local_58 = 0;
        do {
          if (0 < iVar5) {
            iVar8 = 0;
            do {
              fVar9 = -3.4028235e+38;
              if (this->extend_filter != 0) {
                uVar1 = this->stride;
                uVar6 = 0;
                uVar3 = 1;
                auVar10 = ZEXT464(0xff7fffff);
                do {
                  uVar7 = 0;
                  if ((short)uVar3 == 0) {
                    uVar3 = 0;
                  }
                  else {
                    do {
                      pfVar4 = tensor_t<float>::get
                                         (&(this->super_layer_t).in,
                                          uVar6 + (local_5c & 0xffff) * (uint)uVar1,
                                          uVar7 + (uint)uVar1 * (local_58 & 0xffff),iVar8);
                      auVar2 = vmaxss_avx(ZEXT416(auVar10._0_4_),ZEXT416((uint)*pfVar4));
                      auVar10 = ZEXT1664(auVar2);
                      uVar7 = uVar7 + 1;
                      uVar3 = (uint)this->extend_filter;
                    } while (uVar7 < this->extend_filter);
                  }
                  fVar9 = auVar10._0_4_;
                  uVar6 = uVar6 + 1;
                } while (uVar6 < uVar3);
              }
              pfVar4 = tensor_t<float>::get(&(this->super_layer_t).out,local_5c,local_58,iVar8);
              *pfVar4 = fVar9;
              iVar8 = iVar8 + 1;
              iVar5 = (this->super_layer_t).out.size.z;
            } while (iVar8 < iVar5);
            iVar8 = (this->super_layer_t).out.size.y;
          }
          local_58 = local_58 + 1;
        } while ((int)local_58 < iVar8);
        iVar5 = (this->super_layer_t).out.size.x;
      }
      local_5c = local_5c + 1;
    } while ((int)local_5c < iVar5);
  }
  return;
}

Assistant:

void activate() {
    for (int x = 0; x < out.size.x; x++) {
      for (int y = 0; y < out.size.y; y++) {
        for (int z = 0; z < out.size.z; z++) {
          point_t mapped = map_to_input({(uint16_t) x, (uint16_t) y, 0}, 0);
          float mval = -FLT_MAX;
          for (int i = 0; i < extend_filter; i++)
            for (int j = 0; j < extend_filter; j++) {
              float v = in(mapped.x + i, mapped.y + j, z);
              if (v > mval)
                mval = v;
            }
          out(x, y, z) = mval;
        }
      }
    }
  }